

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetWindowSize(ImGuiWindow *window,ImVec2 *size,ImGuiCond cond)

{
  ImGuiCond cond_local;
  ImVec2 *size_local;
  ImGuiWindow *window_local;
  
  if ((cond == 0) || (((*(int *)&window->field_0xaf << 0x10) >> 0x18 & cond) != 0)) {
    *(uint *)&window->field_0xaf =
         *(uint *)&window->field_0xaf & 0xffff00ff |
         ((*(int *)&window->field_0xaf << 0x10) >> 0x18 & 0xf1U) << 8;
    if (size->x <= 0.0) {
      window->AutoFitFramesX = '\x02';
      window->AutoFitOnlyGrows = false;
    }
    else {
      window->AutoFitFramesX = '\0';
      (window->SizeFull).x = (float)(int)size->x;
    }
    if (size->y <= 0.0) {
      window->AutoFitFramesY = '\x02';
      window->AutoFitOnlyGrows = false;
    }
    else {
      window->AutoFitFramesY = '\0';
      (window->SizeFull).y = (float)(int)size->y;
    }
  }
  return;
}

Assistant:

void ImGui::SetWindowSize(ImGuiWindow* window, const ImVec2& size, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowSizeAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowSizeAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);

    // Set
    if (size.x > 0.0f)
    {
        window->AutoFitFramesX = 0;
        window->SizeFull.x = IM_FLOOR(size.x);
    }
    else
    {
        window->AutoFitFramesX = 2;
        window->AutoFitOnlyGrows = false;
    }
    if (size.y > 0.0f)
    {
        window->AutoFitFramesY = 0;
        window->SizeFull.y = IM_FLOOR(size.y);
    }
    else
    {
        window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = false;
    }
}